

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t archive_write_disk_set_user_lookup
                  (archive *_a,void *private_data,
                  _func_int64_t_void_ptr_char_ptr_int64_t *lookup_uid,
                  _func_void_void_ptr *cleanup_uid)

{
  long lVar1;
  int iVar2;
  wchar_t magic_test;
  archive_write_disk *a;
  _func_void_void_ptr *cleanup_uid_local;
  _func_int64_t_void_ptr_char_ptr_int64_t *lookup_uid_local;
  void *private_data_local;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_set_user_lookup");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    lVar1._0_4_ = _a[1].current_codepage;
    lVar1._4_4_ = _a[1].current_oemcp;
    if ((lVar1 != 0) && (_a[1].sconv != (archive_string_conv *)0x0)) {
      (**(code **)&_a[1].current_codepage)(_a[1].sconv);
    }
    _a[1].current_code = (char *)lookup_uid;
    *(_func_void_void_ptr **)&_a[1].current_codepage = cleanup_uid;
    _a[1].sconv = (archive_string_conv *)private_data;
    _a_local._4_4_ = L'\0';
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_disk_set_user_lookup(struct archive *_a,
    void *private_data,
    int64_t (*lookup_uid)(void *private, const char *uname, int64_t uid),
    void (*cleanup_uid)(void *private))
{
	struct archive_write_disk *a = (struct archive_write_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_disk_set_user_lookup");

	if (a->cleanup_uid != NULL && a->lookup_uid_data != NULL)
		(a->cleanup_uid)(a->lookup_uid_data);

	a->lookup_uid = lookup_uid;
	a->cleanup_uid = cleanup_uid;
	a->lookup_uid_data = private_data;
	return (ARCHIVE_OK);
}